

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::FinishDisposeObjects(Recycler *this)

{
  ThreadContextId pvVar1;
  bool bVar2;
  CollectionState CVar3;
  ConfigFlagsTable *pCVar4;
  undefined1 local_58 [8];
  CollectionParam savedCollectionParam;
  Recycler *this_local;
  
  savedCollectionParam._56_8_ = this;
  pCVar4 = GetRecyclerFlagsTable(this);
  bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,DisposePhase);
  if (bVar2) {
    Output::Print(L"[Dispose] AllowDispose in FinishDisposeObject: %d\n",
                  (ulong)(this->allowDispose & 1));
    Output::Flush();
  }
  if (((this->hasDisposableObject & 1U) == 0) || ((this->allowDispose & 1U) == 0)) {
    if (((this->inDispose & 1U) == 0) && ((this->hasDisposableObject & 1U) != 0)) {
      pCVar4 = GetRecyclerFlagsTable(this);
      bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,RecyclerPhase);
      if (bVar2) {
        pvVar1 = this->mainThreadId;
        CVar3 = ObservableValue::operator_cast_to_CollectionState
                          ((ObservableValue *)&this->collectionState);
        Output::Print(L"%04X> RC(%p): %s %d\n",pvVar1,this,L"Dispose object delayed",(ulong)CVar3);
      }
    }
    this_local._7_1_ = false;
  }
  else {
    pCVar4 = GetRecyclerFlagsTable(this);
    bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,DisposePhase);
    if (bVar2) {
      Output::Print(L"[Dispose] FinishDisposeObject, calling Dispose: %d\n",
                    (ulong)(this->allowDispose & 1));
      Output::Flush();
    }
    memcpy(local_58,&this->collectionParam,0x40);
    DisposeObjects(this);
    memcpy(&this->collectionParam,local_58,0x40);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Recycler::FinishDisposeObjects()
{
    CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::DisposePhase, _u("[Dispose] AllowDispose in FinishDisposeObject: %d\n"), this->allowDispose);

    if (this->hasDisposableObject && this->allowDispose)
    {
        CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::DisposePhase, _u("[Dispose] FinishDisposeObject, calling Dispose: %d\n"), this->allowDispose);
#ifdef RECYCLER_TRACE
        CollectionParam savedCollectionParam = collectionParam;
#endif
        DisposeObjects();
#ifdef RECYCLER_TRACE
        collectionParam = savedCollectionParam;
#endif
        // FinishDisposeObjects is always called either during a collection,
        // or we will check the NeedExhaustiveRepeatCollect(), so no need to check it here
        return true;
    }


#ifdef RECYCLER_TRACE
    if (!this->inDispose && this->hasDisposableObject
        && GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
    {
        Output::Print(_u("%04X> RC(%p): %s %d\n"), this->mainThreadId, this, _u("Dispose object delayed"), static_cast<CollectionState>(this->collectionState));
    }
#endif
    return false;
}